

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O2

CBString * vssAttributesToUString(CBString *__return_storage_ptr__,UINT32 attributes)

{
  CBString local_30;
  
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  if ((attributes & 1) != 0) {
    Bstrlib::CBString::CBString(&local_30,", NonVolatile");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 2) != 0) {
    Bstrlib::CBString::CBString(&local_30,", BootService");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 4) != 0) {
    Bstrlib::CBString::CBString(&local_30,", Runtime");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 8) != 0) {
    Bstrlib::CBString::CBString(&local_30,", HwErrorRecord");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 0x10) != 0) {
    Bstrlib::CBString::CBString(&local_30,", AuthWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 0x20) != 0) {
    Bstrlib::CBString::CBString(&local_30,", TimeBasedAuthWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 0x40) != 0) {
    Bstrlib::CBString::CBString(&local_30,", AppendWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((int)attributes < 0) {
    Bstrlib::CBString::CBString(&local_30,", AppleChecksum");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((attributes & 0x7fffff80) != 0) {
    Bstrlib::CBString::CBString(&local_30,", Unknown");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  Bstrlib::CBString::remove(__return_storage_ptr__,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

extern UString vssAttributesToUString(const UINT32 attributes)
{
    UString str;
    if (attributes & NVRAM_VSS_VARIABLE_NON_VOLATILE)                          str += UString(", NonVolatile");
    if (attributes & NVRAM_VSS_VARIABLE_BOOTSERVICE_ACCESS)                    str += UString(", BootService");
    if (attributes & NVRAM_VSS_VARIABLE_RUNTIME_ACCESS)                        str += UString(", Runtime");
    if (attributes & NVRAM_VSS_VARIABLE_HARDWARE_ERROR_RECORD)                 str += UString(", HwErrorRecord");
    if (attributes & NVRAM_VSS_VARIABLE_AUTHENTICATED_WRITE_ACCESS)            str += UString(", AuthWrite");
    if (attributes & NVRAM_VSS_VARIABLE_TIME_BASED_AUTHENTICATED_WRITE_ACCESS) str += UString(", TimeBasedAuthWrite");
    if (attributes & NVRAM_VSS_VARIABLE_APPEND_WRITE)                          str += UString(", AppendWrite");
    if (attributes & NVRAM_VSS_VARIABLE_APPLE_DATA_CHECKSUM)                   str += UString(", AppleChecksum");
    if (attributes & NVRAM_VSS_VARIABLE_UNKNOWN_MASK)                          str += UString(", Unknown");
    
    str.remove(0, 2); // Remove first comma and space
    return str;
}